

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_slider.c
# Opt level: O0

void slider_range(t_slider *x,t_symbol *s,int ac,t_atom *av)

{
  t_float tVar1;
  t_float tVar2;
  int local_44;
  t_atom *av_local;
  int ac_local;
  t_symbol *s_local;
  t_slider *x_local;
  
  tVar1 = atom_getfloatarg(0,ac,av);
  tVar2 = atom_getfloatarg(1,ac,av);
  if (x->x_orientation == horizontal) {
    local_44 = (x->x_gui).x_w;
  }
  else {
    local_44 = (x->x_gui).x_h;
  }
  slider_check_minmax(x,(double)tVar1,(double)tVar2,(float)local_44);
  slider_set(x,x->x_fval);
  return;
}

Assistant:

static void slider_range(t_slider *x, t_symbol *s, int ac, t_atom *av)
{
    slider_check_minmax(x,
        (double)atom_getfloatarg(0, ac, av),
        (double)atom_getfloatarg(1, ac, av),
        (x->x_orientation==horizontal)?x->x_gui.x_w:x->x_gui.x_h);
    slider_set(x, x->x_fval);
}